

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O3

int cmsysProcess_GetOption(cmsysProcess *cp,int optionId)

{
  int iVar1;
  
  iVar1 = 0;
  if (cp != (cmsysProcess *)0x0) {
    if (optionId == 3) {
      iVar1 = cp->Verbatim;
    }
    else {
      if (optionId == 2) {
        return cp->MergeOutput;
      }
      iVar1 = 0;
      if (optionId == 1) {
        return cp->OptionDetach;
      }
    }
  }
  return iVar1;
}

Assistant:

int kwsysProcess_GetOption(kwsysProcess* cp, int optionId)
{
  if(!cp)
    {
    return 0;
    }

  switch(optionId)
    {
    case kwsysProcess_Option_Detach: return cp->OptionDetach;
    case kwsysProcess_Option_MergeOutput: return cp->MergeOutput;
    case kwsysProcess_Option_Verbatim: return cp->Verbatim;
    default: return 0;
    }
}